

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  cmCTest *pcVar4;
  undefined8 uVar5;
  int iVar6;
  cmCTestBuildHandler *pcVar7;
  cmValue cVar8;
  cmValue cVar9;
  string *native;
  string *target;
  cmake *gname;
  cmGlobalGenerator *pcVar10;
  ostream *poVar11;
  bool bVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string buildCommand;
  string cmakeBuildConfiguration;
  ostringstream cmCTestLog_msg;
  string dir;
  string local_248;
  string local_228;
  string *local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [360];
  undefined1 local_88 [24];
  undefined1 local_70 [32];
  _Base_ptr local_50;
  long local_40;
  
  pcVar7 = cmCTest::GetBuildHandler((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(pcVar7->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(pcVar7);
  this->Handler = pcVar7;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_200._0_8_ = (cmGlobalGenerator *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CTEST_BUILD_COMMAND","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_200);
  if ((cmGlobalGenerator *)local_200._0_8_ != (cmGlobalGenerator *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
               cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
    goto LAB_0023b8a8;
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_200._0_8_ = (cmGlobalGenerator *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CTEST_CMAKE_GENERATOR","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_200);
  if ((cmGlobalGenerator *)local_200._0_8_ != (cmGlobalGenerator *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_200._0_8_ = (cmGlobalGenerator *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"CTEST_BUILD_CONFIGURATION","");
  cVar9 = cmMakefile::GetDefinition(pcVar1,(string *)local_200);
  if ((cmGlobalGenerator *)local_200._0_8_ != (cmGlobalGenerator *)local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  if ((this->Configuration)._M_string_length == 0) {
    if ((cVar9.Value == (string *)0x0) || ((cVar9.Value)->_M_string_length == 0)) {
      cVar9.Value = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    }
  }
  else {
    cVar9.Value = &this->Configuration;
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  pcVar2 = ((cVar9.Value)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar2,pcVar2 + (cVar9.Value)->_M_string_length);
  if ((this->Flags)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_200._0_8_ = (cmGlobalGenerator *)local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CTEST_BUILD_FLAGS","");
    native = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_200);
    if ((cmGlobalGenerator *)local_200._0_8_ != (cmGlobalGenerator *)local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
    }
  }
  else {
    native = &this->Flags;
  }
  if ((this->Target)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CTEST_BUILD_TARGET","");
    target = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_200);
    if ((cmGlobalGenerator *)local_200._0_8_ != (cmGlobalGenerator *)local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
    }
  }
  else {
    target = &this->Target;
  }
  if ((cVar8.Value == (string *)0x0) || ((cVar8.Value)->_M_string_length == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,
               "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
               ,0xbf);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,(string *)local_88);
    if ((_Base_ptr)local_88._0_8_ != (_Base_ptr)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x60));
    goto LAB_0023b5da;
  }
  if (local_228._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)0x0,0x8778b0);
  }
  pcVar3 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  if (pcVar3 == (cmGlobalGenerator *)0x0) {
LAB_0023b65c:
    gname = cmMakefile::GetCMakeInstance
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                       Makefile);
    cmake::CreateGlobalGenerator((cmake *)local_200,(string *)gname,SUB81(cVar8.Value,0));
    pcVar10 = (cmGlobalGenerator *)local_200._0_8_;
    local_200._0_8_ = (cmGlobalGenerator *)0x0;
    pcVar3 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    (this->GlobalGenerator)._M_t.
    super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = pcVar10;
    if (pcVar3 != (cmGlobalGenerator *)0x0) {
      (*pcVar3->_vptr_cmGlobalGenerator[1])();
      if ((cmGlobalGenerator *)local_200._0_8_ != (cmGlobalGenerator *)0x0) {
        (**(code **)(*(long *)local_200._0_8_ + 8))();
      }
      pcVar10 = (this->GlobalGenerator)._M_t.
                super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    }
    if (pcVar10 == (cmGlobalGenerator *)0x0) {
      local_200._0_8_ = (cmGlobalGenerator *)0x22;
      local_200._8_8_ = "could not create generator named \"";
      local_1f0._0_8_ = (_func_int **)0x0;
      local_1f0._16_8_ = ((cVar8.Value)->_M_dataplus)._M_p;
      local_1f0._8_8_ = (cVar8.Value)->_M_string_length;
      local_1f0._24_8_ = (pointer)0x0;
      local_1f0._40_8_ = local_70;
      local_88._0_8_ = (_Base_ptr)0x0;
      local_88._8_8_ = (_Base_ptr)0x1;
      local_70[0] = '\"';
      local_1f0._32_8_ = 1;
      local_1f0._48_8_ = (_Base_ptr)0x0;
      views._M_len = 3;
      views._M_array = (iterator)local_200;
      local_88._16_8_ = local_1f0._40_8_;
      cmCatViews(&local_248,views);
      cmMakefile::IssueMessage
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile,
                 FATAL_ERROR,&local_248);
      cmSystemTools::s_FatalErrorOccurred = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
LAB_0023b5da:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      return (cmCTestGenericHandler *)0x0;
    }
  }
  else {
    (*pcVar3->_vptr_cmGlobalGenerator[3])(local_200);
    uVar5 = local_200._0_8_;
    local_208 = target;
    if ((pointer)local_200._8_8_ == (pointer)(cVar8.Value)->_M_string_length) {
      if ((pointer)local_200._8_8_ == (pointer)0x0) {
        bVar12 = false;
      }
      else {
        iVar6 = bcmp((void *)local_200._0_8_,((cVar8.Value)->_M_dataplus)._M_p,local_200._8_8_);
        bVar12 = iVar6 != 0;
      }
    }
    else {
      bVar12 = true;
    }
    if ((cmGlobalGenerator *)uVar5 != (cmGlobalGenerator *)local_1f0) {
      operator_delete((void *)uVar5,local_1f0._0_8_ + 1);
    }
    target = local_208;
    if (bVar12) {
      pcVar3 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
      if (pcVar3 == (cmGlobalGenerator *)0x0) goto LAB_0023b65c;
      (*pcVar3->_vptr_cmGlobalGenerator[1])();
    }
    if ((this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0)
    goto LAB_0023b65c;
  }
  if (local_228._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)0x0,0x936da9);
  }
  pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_200._0_8_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"BuildDirectory","");
  cmCTest::GetCTestConfiguration((string *)local_88,pcVar4,(string *)local_200);
  if ((undefined1 *)local_200._0_8_ != local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  pcVar3 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  bVar12 = cmMakefile::IgnoreErrorsCMP0061
                     ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                      Makefile);
  cmGlobalGenerator::GenerateCMakeBuildCommand
            (&local_248,pcVar3,target,&local_228,&this->ParallelLevel,native,bVar12);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"SetMakeCommand:",0xf);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
               ,0x70,(char *)local_50,(this->super_cmCTestHandlerCommand).Quiet);
  if (local_50 != (_Base_ptr)&local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x60));
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",&local_248
             ,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr)local_88._0_8_ != (_Base_ptr)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
LAB_0023b8a8:
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_200._0_8_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CTEST_USE_LAUNCHERS","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_200);
  if ((undefined1 *)local_200._0_8_ != local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
               cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_200._0_8_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"CTEST_LABELS_FOR_SUBPROJECTS","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_200);
  if ((undefined1 *)local_200._0_8_ != local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  (pcVar7->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &pcVar7->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  cmValue ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (cmNonempty(ctestBuildCommand)) {
    this->CTest->SetCTestConfiguration("MakeCommand", *ctestBuildCommand,
                                       this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    cmValue ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    std::string cmakeBuildConfiguration = cmNonempty(this->Configuration)
      ? this->Configuration
      : cmNonempty(ctestBuildConfiguration) ? *ctestBuildConfiguration
                                            : this->CTest->GetConfigType();

    const std::string& cmakeBuildAdditionalFlags = cmNonempty(this->Flags)
      ? this->Flags
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_FLAGS");
    const std::string& cmakeBuildTarget = cmNonempty(this->Target)
      ? this->Target
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_TARGET");

    if (cmNonempty(cmakeGeneratorName)) {
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != *cmakeGeneratorName) {
          this->GlobalGenerator.reset();
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            *cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = cmStrCat("could not create generator named \"",
                                   *cmakeGeneratorName, '"');
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccurred();
          return nullptr;
        }
      }
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Debug";
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget, cmakeBuildConfiguration, this->ParallelLevel,
          cmakeBuildAdditionalFlags, this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand,
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (cmValue useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", *useLaunchers,
                                       this->Quiet);
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}